

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

int __thiscall FixedSizeCache<int>::max(FixedSizeCache<int> *this)

{
  pointer piVar1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  runtime_error *this_00;
  
  if ((long)this->_count != 0) {
    piVar1 = (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    _Var2 = std::
            __max_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (piVar1,piVar1 + this->_count);
    return *_Var2._M_current;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"FixedSizeCache::max() called on empty cache");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool
    empty() const
    {
        return (this->_count == 0);
    }